

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

ProcessorProperty * __thiscall
soul::StructuralParser::parseProcessorProperty(StructuralParser *this)

{
  Expression *pEVar1;
  Property PVar2;
  uint uVar3;
  ModuleBase *pMVar4;
  ProcessorProperty *pPVar5;
  CompileMessage local_d8;
  CompileMessage local_a0;
  string local_68;
  Property local_48 [2];
  Property property;
  UnqualifiedName *local_38;
  UnqualifiedName *propertyName;
  Context context;
  StructuralParser *this_local;
  
  context.parentScope = (Scope *)0x548358;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x548358);
  getContext((Context *)&propertyName,this);
  local_38 = parseUnqualifiedName(this);
  AST::UnqualifiedName::toString_abi_cxx11_(&local_68,local_38);
  PVar2 = heart::ProcessorProperty::getPropertyFromName(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  local_48[0] = PVar2;
  if (PVar2 == none) {
    pEVar1 = &local_38->super_Expression;
    Errors::unknownProperty<>();
    AST::Context::throwError(&(pEVar1->super_Statement).super_ASTObject.context,&local_a0,false);
  }
  pMVar4 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
  uVar3 = (*(pMVar4->super_ASTObject)._vptr_ASTObject[4])();
  if ((uVar3 & 1) == 0) {
    pMVar4 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
    uVar3 = (*(pMVar4->super_ASTObject)._vptr_ASTObject[5])();
    if ((uVar3 & 1) == 0) {
      Errors::propertiesOutsideProcessor<>();
      AST::Context::throwError((Context *)&propertyName,&local_d8,false);
    }
  }
  pPVar5 = allocate<soul::AST::ProcessorProperty,soul::AST::Context&,soul::heart::ProcessorProperty::Property&>
                     (this,(Context *)&propertyName,local_48);
  AST::Context::~Context((Context *)&propertyName);
  return pPVar5;
}

Assistant:

AST::ProcessorProperty& parseProcessorProperty()
    {
        expect (Operator::dot);
        auto context = getContext();
        auto& propertyName = parseUnqualifiedName();

        auto property = heart::ProcessorProperty::getPropertyFromName (propertyName.toString());

        if (property == heart::ProcessorProperty::Property::none)
            propertyName.context.throwError (Errors::unknownProperty());

        if (! (module->isProcessor() || module->isGraph()))
            context.throwError (Errors::propertiesOutsideProcessor());

        return allocate<AST::ProcessorProperty> (context, property);
    }